

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O1

bool __thiscall
YAML::Utils::WriteComment(Utils *this,ostream_wrapper *out,string *str,size_t postCommentIndent)

{
  ulong uVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  int codePoint;
  const_iterator i;
  undefined1 local_47;
  char local_46;
  undefined1 local_45;
  int local_44;
  string *local_40;
  const_iterator local_38;
  
  uVar1 = *(ulong *)(this + 0x30);
  ostream_wrapper::write((ostream_wrapper *)this,0x76b184,(void *)0x1,postCommentIndent);
  local_40 = str;
  if (str != (string *)0x0) {
    do {
      local_47 = 0x20;
      ostream_wrapper::write((ostream_wrapper *)this,(int)&local_47,(void *)0x1,postCommentIndent);
      str = (string *)((long)&str[-1].field_2 + 0xf);
    } while (str != (string *)0x0);
  }
  this[0x38] = (Utils)0x1;
  local_38._M_current =
       (out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  bVar2 = anon_unknown_0::GetNextCodePointAndAdvance
                    (&local_44,&local_38,
                     (const_iterator)
                     (local_38._M_current +
                     (long)(out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish));
  if (bVar2) {
    do {
      if (local_44 == 10) {
        pcVar4 = "\n";
        while (ostream_wrapper::write
                         ((ostream_wrapper *)this,(int)pcVar4,(void *)0x1,postCommentIndent),
              *(ulong *)(this + 0x30) < uVar1) {
          local_46 = ' ';
          pcVar4 = &local_46;
        }
        ostream_wrapper::write((ostream_wrapper *)this,0x76b184,(void *)0x1,postCommentIndent);
        for (psVar3 = local_40; psVar3 != (string *)0x0;
            psVar3 = (string *)((long)&psVar3[-1].field_2 + 0xf)) {
          local_45 = 0x20;
          ostream_wrapper::write
                    ((ostream_wrapper *)this,(int)&local_45,(void *)0x1,postCommentIndent);
        }
        this[0x38] = (Utils)0x1;
      }
      else {
        anon_unknown_0::WriteCodePoint((ostream_wrapper *)this,local_44);
      }
      bVar2 = anon_unknown_0::GetNextCodePointAndAdvance
                        (&local_44,&local_38,
                         (const_iterator)
                         ((out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                         (long)(out->m_buffer).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start));
    } while (bVar2);
  }
  return true;
}

Assistant:

bool WriteComment(ostream_wrapper& out, const std::string& str,
                  std::size_t postCommentIndent) {
  const std::size_t curIndent = out.col();
  out << "#" << Indentation(postCommentIndent);
  out.set_comment();
  int codePoint;
  for (std::string::const_iterator i = str.begin();
       GetNextCodePointAndAdvance(codePoint, i, str.end());) {
    if (codePoint == '\n') {
      out << "\n"
          << IndentTo(curIndent) << "#" << Indentation(postCommentIndent);
      out.set_comment();
    } else {
      WriteCodePoint(out, codePoint);
    }
  }
  return true;
}